

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

int checkmonth(char *check,size_t len)

{
  int iVar1;
  char **local_30;
  char **what;
  int i;
  size_t len_local;
  char *check_local;
  
  local_30 = Curl_month;
  if (len == 3) {
    for (what._4_4_ = 0; what._4_4_ < 0xc; what._4_4_ = what._4_4_ + 1) {
      iVar1 = curl_strnequal(check,*local_30,3);
      if (iVar1 != 0) {
        return what._4_4_;
      }
      local_30 = local_30 + 1;
    }
  }
  return -1;
}

Assistant:

static int checkmonth(const char *check, size_t len)
{
  int i;
  const char * const *what = &Curl_month[0];
  if(len != 3)
    return -1; /* not a month */

  for(i = 0; i<12; i++) {
    if(strncasecompare(check, what[0], 3))
      return i;
    what++;
  }
  return -1; /* return the offset or -1, no real offset is -1 */
}